

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-docs.cpp
# Opt level: O2

void export_md(string *fname,llama_example ex)

{
  bool bVar1;
  common_arg *opt;
  pointer this;
  common_arg *local_1610;
  vector<common_arg_*,_std::allocator<common_arg_*>_> specific_options;
  vector<common_arg_*,_std::allocator<common_arg_*>_> sparam_options;
  vector<common_arg_*,_std::allocator<common_arg_*>_> common_options;
  common_params_context ctx_arg;
  ofstream file;
  common_params params;
  
  std::ofstream::ofstream(&file,(string *)fname,_S_trunc|_S_out);
  common_params::common_params(&params);
  common_params_parser_init(&ctx_arg,&params,ex,(_func_void_int_char_ptr_ptr *)0x0);
  common_options.super__Vector_base<common_arg_*,_std::allocator<common_arg_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  common_options.super__Vector_base<common_arg_*,_std::allocator<common_arg_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  common_options.super__Vector_base<common_arg_*,_std::allocator<common_arg_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  sparam_options.super__Vector_base<common_arg_*,_std::allocator<common_arg_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  sparam_options.super__Vector_base<common_arg_*,_std::allocator<common_arg_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  sparam_options.super__Vector_base<common_arg_*,_std::allocator<common_arg_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  specific_options.super__Vector_base<common_arg_*,_std::allocator<common_arg_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  specific_options.super__Vector_base<common_arg_*,_std::allocator<common_arg_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  specific_options.super__Vector_base<common_arg_*,_std::allocator<common_arg_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (this = ctx_arg.options.super__Vector_base<common_arg,_std::allocator<common_arg>_>._M_impl.
              super__Vector_impl_data._M_start;
      this != ctx_arg.options.super__Vector_base<common_arg,_std::allocator<common_arg>_>._M_impl.
              super__Vector_impl_data._M_finish; this = this + 1) {
    if (this->is_sparam == true) {
      local_1610 = this;
      std::vector<common_arg*,std::allocator<common_arg*>>::emplace_back<common_arg*>
                ((vector<common_arg*,std::allocator<common_arg*>> *)&sparam_options,&local_1610);
    }
    else {
      bVar1 = common_arg::in_example(this,ctx_arg.ex);
      if (bVar1) {
        local_1610 = this;
        std::vector<common_arg*,std::allocator<common_arg*>>::emplace_back<common_arg*>
                  ((vector<common_arg*,std::allocator<common_arg*>> *)&specific_options,&local_1610)
        ;
      }
      else {
        local_1610 = this;
        std::vector<common_arg*,std::allocator<common_arg*>>::emplace_back<common_arg*>
                  ((vector<common_arg*,std::allocator<common_arg*>> *)&common_options,&local_1610);
      }
    }
  }
  std::operator<<((ostream *)&file,"**Common params**\n\n");
  write_table(&file,&common_options);
  std::operator<<((ostream *)&file,"\n\n**Sampling params**\n\n");
  write_table(&file,&sparam_options);
  std::operator<<((ostream *)&file,"\n\n**Example-specific params**\n\n");
  write_table(&file,&specific_options);
  std::_Vector_base<common_arg_*,_std::allocator<common_arg_*>_>::~_Vector_base
            (&specific_options.super__Vector_base<common_arg_*,_std::allocator<common_arg_*>_>);
  std::_Vector_base<common_arg_*,_std::allocator<common_arg_*>_>::~_Vector_base
            (&sparam_options.super__Vector_base<common_arg_*,_std::allocator<common_arg_*>_>);
  std::_Vector_base<common_arg_*,_std::allocator<common_arg_*>_>::~_Vector_base
            (&common_options.super__Vector_base<common_arg_*,_std::allocator<common_arg_*>_>);
  std::vector<common_arg,_std::allocator<common_arg>_>::~vector(&ctx_arg.options);
  common_params::~common_params(&params);
  std::ofstream::~ofstream(&file);
  return;
}

Assistant:

static void export_md(std::string fname, llama_example ex) {
    std::ofstream file(fname, std::ofstream::out | std::ofstream::trunc);

    common_params params;
    auto ctx_arg = common_params_parser_init(params, ex);

    std::vector<common_arg *> common_options;
    std::vector<common_arg *> sparam_options;
    std::vector<common_arg *> specific_options;
    for (auto & opt : ctx_arg.options) {
        // in case multiple LLAMA_EXAMPLE_* are set, we prioritize the LLAMA_EXAMPLE_* matching current example
        if (opt.is_sparam) {
            sparam_options.push_back(&opt);
        } else if (opt.in_example(ctx_arg.ex)) {
            specific_options.push_back(&opt);
        } else {
            common_options.push_back(&opt);
        }
    }

    file << "**Common params**\n\n";
    write_table(file, common_options);
    file << "\n\n**Sampling params**\n\n";
    write_table(file, sparam_options);
    file << "\n\n**Example-specific params**\n\n";
    write_table(file, specific_options);
}